

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_rp_pack_rects(nk_rp_context *context,nk_rp_rect *rects,int num_rects)

{
  nk_rp_node **ppnVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  nk_rp_node *pnVar5;
  nk_rp_coord nVar6;
  nk_rp_coord nVar7;
  nk_rp_coord nVar8;
  nk_rp_coord nVar9;
  int iVar10;
  nk_rp_coord nVar11;
  nk_rp_coord nVar12;
  nk_rp_coord nVar13;
  nk_rp_coord nVar14;
  int iVar15;
  nk_rp_context *pnVar16;
  int iVar17;
  uint uVar18;
  int *piVar19;
  nk_rp_node **ppnVar20;
  long lVar21;
  ulong uVar22;
  nk_rp_node *pnVar23;
  uint uVar24;
  uint uVar25;
  nk_rp_node *in_R8;
  nk_rp_node *pnVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  int iVar30;
  ulong uVar31;
  nk_rp_context *pnVar32;
  nk_rp_node **ppnVar33;
  nk_rp_rect *pnVar34;
  nk_rp_context *pnVar35;
  nk_rp_rect *pnVar36;
  bool bVar37;
  int waste;
  int local_1a0;
  uint local_19c;
  nk_rp_node **local_190;
  uint local_138 [66];
  
  uVar31 = (ulong)(uint)num_rects;
  if (0 < num_rects) {
    piVar19 = &rects->was_packed;
    uVar22 = 0;
    do {
      *piVar19 = (int)uVar22;
      uVar22 = uVar22 + 1;
      piVar19 = piVar19 + 4;
    } while (uVar31 != uVar22);
  }
  nk_rp_qsort(rects,num_rects,nk_rect_height_compare);
  if (0 < num_rects) {
    ppnVar1 = &context->active_head;
    uVar22 = 0;
    do {
      uVar2 = rects[uVar22].w;
      iVar17 = context->align;
      iVar30 = iVar17 + (uint)uVar2 + -1;
      iVar30 = iVar30 - iVar30 % iVar17;
      if (iVar30 % iVar17 != 0) {
        __assert_fail("width % c->align == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                      ,0x297c,
                      "struct nk_rp__findresult nk_rp__skyline_find_best_pos(struct nk_rp_context *, int, int)"
                     );
      }
      uVar3 = rects[uVar22].h;
      uVar4 = *(ushort *)&((nk_rp_context *)context->active_head)->width;
      if (context->width < (int)(iVar30 + (uint)uVar4)) {
        local_1a0 = 0x40000000;
        local_190 = (nk_rp_node **)0x0;
        local_19c = 0x40000000;
      }
      else {
        local_19c = 0x40000000;
        local_190 = (nk_rp_node **)0x0;
        local_1a0 = 0x40000000;
        pnVar32 = (nk_rp_context *)context->active_head;
        ppnVar33 = ppnVar1;
        do {
          iVar17 = nk_rp__skyline_find_min_y
                             (pnVar32,(nk_rp_node *)(ulong)uVar4,iVar30,(int)local_138,(int *)in_R8)
          ;
          if (context->heuristic == 0) {
            if (iVar17 < local_1a0) {
              local_1a0 = iVar17;
              local_190 = ppnVar33;
            }
          }
          else if (((int)((uint)uVar3 + iVar17) <= context->height) &&
                  ((iVar17 < local_1a0 ||
                   ((iVar17 == local_1a0 && ((int)local_138[0] < (int)local_19c)))))) {
            local_19c = local_138[0];
            local_1a0 = iVar17;
            local_190 = ppnVar33;
          }
          ppnVar33 = (nk_rp_node **)&pnVar32->align;
          uVar4 = (ushort)(*(nk_rp_context **)&pnVar32->align)->width;
          pnVar32 = *(nk_rp_context **)&pnVar32->align;
        } while ((int)(iVar30 + (uint)uVar4) <= context->width);
      }
      if (local_190 == (nk_rp_node **)0x0) {
        uVar18 = 0;
      }
      else {
        uVar18 = (uint)(*local_190)->x;
      }
      if (context->heuristic == 1) {
        pnVar32 = (nk_rp_context *)*ppnVar1;
        uVar4 = (ushort)pnVar32->width;
        pnVar35 = pnVar32;
        while (ppnVar33 = ppnVar1, (int)(uint)uVar4 < iVar30) {
          pnVar35 = *(nk_rp_context **)&pnVar35->align;
          uVar4 = (ushort)pnVar35->width;
        }
        do {
          uVar24 = (uint)(ushort)pnVar35->width - iVar30;
          pnVar16 = pnVar32;
          if ((int)uVar24 < 0) {
            __assert_fail("xpos >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                          ,0x29b6,
                          "struct nk_rp__findresult nk_rp__skyline_find_best_pos(struct nk_rp_context *, int, int)"
                         );
          }
          do {
            pnVar32 = pnVar16;
            ppnVar20 = ppnVar33;
            ppnVar33 = (nk_rp_node **)&pnVar32->align;
            pnVar16 = *(nk_rp_context **)&pnVar32->align;
          } while ((int)(uint)(ushort)(*(nk_rp_context **)&pnVar32->align)->width <= (int)uVar24);
          if ((int)uVar24 < (int)(uint)(ushort)pnVar32->width) {
            __assert_fail("node->next->x > xpos && node->x <= xpos",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                          ,0x29bc,
                          "struct nk_rp__findresult nk_rp__skyline_find_best_pos(struct nk_rp_context *, int, int)"
                         );
          }
          iVar17 = nk_rp__skyline_find_min_y
                             (pnVar32,(nk_rp_node *)(ulong)uVar24,iVar30,(int)local_138,(int *)in_R8
                             );
          if ((((int)((uint)uVar3 + iVar17) < context->height) && (iVar17 <= local_1a0)) &&
             (((iVar17 < local_1a0 || ((int)local_138[0] < (int)local_19c)) ||
              ((local_138[0] == local_19c && ((int)uVar24 < (int)uVar18)))))) {
            local_19c = local_138[0];
            local_1a0 = iVar17;
            local_190 = ppnVar20;
            uVar18 = uVar24;
          }
          pnVar35 = *(nk_rp_context **)&pnVar35->align;
          ppnVar33 = ppnVar20;
        } while (pnVar35 != (nk_rp_context *)0x0);
      }
      if (((local_190 == (nk_rp_node **)0x0) ||
          (iVar17 = (uint)uVar3 + local_1a0, context->height < iVar17)) ||
         (pnVar5 = context->free_head, pnVar5 == (nk_rp_node *)0x0)) {
        rects[uVar22].x = 0xffff;
        rects[uVar22].y = 0xffff;
      }
      else {
        pnVar5->x = (nk_rp_coord)uVar18;
        pnVar5->y = (nk_rp_coord)iVar17;
        context->free_head = pnVar5->next;
        pnVar26 = *local_190;
        pnVar23 = pnVar26;
        if ((int)(uint)pnVar26->x < (int)uVar18) {
          pnVar23 = pnVar26->next;
          local_190 = &pnVar26->next;
        }
        *local_190 = pnVar5;
        in_R8 = pnVar23->next;
        if (in_R8 != (nk_rp_node *)0x0) {
          do {
            pnVar26 = in_R8;
            in_R8 = (nk_rp_node *)(ulong)pnVar26->x;
            if ((int)(uVar18 + uVar2) < (int)(uint)pnVar26->x) goto LAB_00143253;
            pnVar23->next = context->free_head;
            context->free_head = pnVar23;
            pnVar23 = pnVar26;
            in_R8 = pnVar26->next;
          } while (pnVar26->next != (nk_rp_node *)0x0);
          in_R8 = (nk_rp_node *)0x0;
        }
LAB_00143253:
        pnVar5->next = pnVar23;
        iVar17 = uVar2 + uVar18;
        if ((int)(uint)pnVar23->x < iVar17) {
          pnVar23->x = (nk_rp_coord)iVar17;
        }
        rects[uVar22].x = (nk_rp_coord)uVar18;
        rects[uVar22].y = (nk_rp_coord)local_1a0;
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != uVar31);
  }
  uVar24 = ((uint)num_rects >> 1) * 0x10dcd + 1;
  uVar25 = 0;
  uVar22 = 0;
  uVar18 = num_rects;
  while( true ) {
    uVar27 = (uint)uVar22;
    if (uVar25 + 1 < uVar18) {
      do {
        bVar37 = (int)uVar22 == 0x40;
        if (bVar37) {
          uVar18 = local_138[0];
        }
        uVar28 = (ulong)uVar18;
        if (bVar37) {
          uVar22 = 0;
        }
        iVar17 = rects[uVar24 % (uVar18 - uVar25) + uVar25].was_packed;
        local_138[uVar22] = uVar18;
        uVar29 = (ulong)(uVar25 - 1);
        while( true ) {
          do {
            uVar27 = (int)uVar29 + 1;
            uVar29 = (ulong)uVar27;
          } while (rects[uVar29].was_packed < iVar17);
          pnVar34 = rects + uVar29;
          do {
            uVar18 = (uint)uVar28;
            uVar28 = (ulong)(uVar18 - 1);
          } while (iVar17 < rects[uVar28].was_packed);
          if (uVar18 - 1 <= uVar27) break;
          pnVar36 = rects + uVar28;
          iVar10 = pnVar34->id;
          nVar11 = pnVar34->w;
          nVar12 = pnVar34->h;
          nVar13 = pnVar34->x;
          nVar14 = pnVar34->y;
          iVar15 = pnVar34->was_packed;
          nVar6 = pnVar36->w;
          nVar7 = pnVar36->h;
          nVar8 = pnVar36->x;
          nVar9 = pnVar36->y;
          iVar30 = pnVar36->was_packed;
          pnVar34->id = pnVar36->id;
          pnVar34->w = nVar6;
          pnVar34->h = nVar7;
          pnVar34->x = nVar8;
          pnVar34->y = nVar9;
          pnVar34->was_packed = iVar30;
          pnVar36->id = iVar10;
          pnVar36->w = nVar11;
          pnVar36->h = nVar12;
          pnVar36->x = nVar13;
          pnVar36->y = nVar14;
          pnVar36->was_packed = iVar15;
        }
        uVar24 = uVar24 * 0x10dcd + 1;
        uVar27 = (int)uVar22 + 1;
        uVar22 = (ulong)uVar27;
      } while (uVar25 + 1 < uVar18);
    }
    uVar25 = uVar18;
    if (uVar27 == 0) break;
    uVar22 = (ulong)(uVar27 - 1);
    uVar18 = local_138[uVar22];
  }
  if (0 < num_rects) {
    lVar21 = 0;
    do {
      uVar18 = 1;
      if (*(short *)((long)&rects->x + lVar21) == -1) {
        uVar18 = (uint)(*(short *)((long)&rects->y + lVar21) != -1);
      }
      *(uint *)((long)&rects->was_packed + lVar21) = uVar18;
      lVar21 = lVar21 + 0x10;
    } while (uVar31 * 0x10 != lVar21);
  }
  return;
}

Assistant:

NK_INTERN void
nk_rp_pack_rects(struct nk_rp_context *context, struct nk_rp_rect *rects, int num_rects)
{
    int i;
    /* we use the 'was_packed' field internally to allow sorting/unsorting */
    for (i=0; i < num_rects; ++i) {
        rects[i].was_packed = i;
    }

    /* sort according to heuristic */
    nk_rp_qsort(rects, (unsigned)num_rects, nk_rect_height_compare);

    for (i=0; i < num_rects; ++i) {
        struct nk_rp__findresult fr = nk_rp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
        if (fr.prev_link) {
            rects[i].x = (nk_rp_coord) fr.x;
            rects[i].y = (nk_rp_coord) fr.y;
        } else {
            rects[i].x = rects[i].y = NK_RP__MAXVAL;
        }
    }

    /* unsort */
    nk_rp_qsort(rects, (unsigned)num_rects, nk_rect_original_order);

    /* set was_packed flags */
    for (i=0; i < num_rects; ++i)
        rects[i].was_packed = !(rects[i].x == NK_RP__MAXVAL && rects[i].y == NK_RP__MAXVAL);
}